

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O0

int __thiscall ncnn::Normalize::load_model(Normalize *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  Mat *in_RDI;
  Mat *this_00;
  Mat local_60;
  int local_4;
  
  this_00 = &local_60;
  (**(code **)(*in_RSI + 0x10))(this_00,in_RSI,*(undefined4 *)&in_RDI[3].refcount,1);
  ncnn::Mat::operator=(this_00,in_RDI);
  ncnn::Mat::~Mat((Mat *)0x6a23c0);
  bVar1 = ncnn::Mat::empty(in_RDI);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Normalize::load_model(const ModelBin& mb)
{
    scale_data = mb.load(scale_data_size, 1);
    if (scale_data.empty())
        return -100;

    return 0;
}